

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

numtree_number __thiscall QPDFNumberTreeObjectHelper::getMin(QPDFNumberTreeObjectHelper *this)

{
  bool bVar1;
  iterator i;
  iterator iStack_68;
  iterator local_38;
  
  begin(&iStack_68,this);
  end(&local_38,this);
  bVar1 = NNTreeIterator::operator==
                    (iStack_68.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_38.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&local_38);
  if (bVar1) {
    iStack_68.ivalue.first = 0;
  }
  else {
    iterator::updateIValue(&iStack_68);
  }
  iterator::~iterator(&iStack_68);
  return iStack_68.ivalue.first;
}

Assistant:

QPDFNumberTreeObjectHelper::numtree_number
QPDFNumberTreeObjectHelper::getMin()
{
    auto i = begin();
    if (i == end()) {
        return 0;
    }
    return i->first;
}